

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O0

GLuint __thiscall CS248::OSDText::compile_shaders(OSDText *this)

{
  PFNGLGETPROGRAMINFOLOGPROC p_Var1;
  PFNGLGETSHADERINFOLOGPROC p_Var2;
  int iVar3;
  reference pvVar4;
  GLchar *pGVar5;
  ulong uVar6;
  char *errorMessage;
  GLint errorMessageLength;
  vector<char,_std::allocator<char>_> program_errmsg;
  GLuint program_id;
  vector<char,_std::allocator<char>_> frag_shader_errmsg;
  vector<char,_std::allocator<char>_> vert_shader_errmsg;
  char *src;
  int info_length;
  GLint result;
  string frag_shader_src;
  string vert_shader_src;
  string version;
  GLuint frag_shader;
  GLuint vert_shader;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffe08;
  GLuint GVar8;
  undefined4 in_stack_fffffffffffffe0c;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  GLsizei *pGVar9;
  int local_148;
  allocator<char> local_141;
  vector<char,_std::allocator<char>_> local_140;
  GLuint local_128;
  allocator<char> local_121;
  vector<char,_std::allocator<char>_> local_120;
  allocator<char> local_101;
  vector<char,_std::allocator<char>_> local_100;
  GLchar *local_e8;
  int local_dc;
  GLint local_d8;
  allocator local_d1;
  string local_d0 [32];
  string local_b0 [39];
  allocator local_89;
  string local_88 [32];
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  GLuint local_10;
  GLuint local_c;
  
  local_c = (*__glewCreateShader)(0x8b31);
  local_10 = (*__glewCreateShader)(0x8b30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"#version 130\n",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_88,
             "in vec4 coord;\nout vec2 texpos;\nvoid main(void) {\n  gl_Position = vec4(coord.xy, 0, 1);\n  texpos = coord.zw;\n}"
             ,&local_89);
  std::operator+(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d0,
             "uniform sampler2D tex;\nuniform vec4 color;\nin vec2 texpos;\nout vec4 fragColor;\nvoid main(void) {\n  fragColor = vec4(1, 1, 1, texture(tex, texpos).r) * color;\n}"
             ,&local_d1);
  std::operator+(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  local_d8 = 0;
  local_e8 = (GLchar *)std::__cxx11::string::c_str();
  (*__glewShaderSource)(local_c,1,&local_e8,(GLint *)0x0);
  (*__glewCompileShader)(local_c);
  (*__glewGetShaderiv)(local_c,0x8b81,&local_d8);
  (*__glewGetShaderiv)(local_c,0x8b84,&local_dc);
  if (0 < local_dc) {
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              (in_stack_fffffffffffffe10,
               CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
               (allocator_type *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    std::allocator<char>::~allocator(&local_101);
    GVar8 = local_c;
    iVar3 = local_dc;
    p_Var2 = __glewGetShaderInfoLog;
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](&local_100,0);
    (*p_Var2)(GVar8,iVar3,(GLsizei *)0x0,pvVar4);
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](&local_100,0);
    printf("%s\n",pvVar4);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  }
  local_e8 = (GLchar *)std::__cxx11::string::c_str();
  (*__glewShaderSource)(local_10,1,&local_e8,(GLint *)0x0);
  (*__glewCompileShader)(local_10);
  (*__glewGetShaderiv)(local_10,0x8b81,&local_d8);
  (*__glewGetShaderiv)(local_10,0x8b84,&local_dc);
  if (0 < local_dc) {
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              (in_stack_fffffffffffffe10,
               CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
               (allocator_type *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    std::allocator<char>::~allocator(&local_121);
    GVar8 = local_10;
    iVar3 = local_dc;
    p_Var2 = __glewGetShaderInfoLog;
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](&local_120,0);
    (*p_Var2)(GVar8,iVar3,(GLsizei *)0x0,pvVar4);
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](&local_120,0);
    printf("%s\n",pvVar4);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  }
  local_128 = (*__glewCreateProgram)();
  (*__glewAttachShader)(local_128,local_c);
  (*__glewAttachShader)(local_128,local_10);
  (*__glewLinkProgram)(local_128);
  (*__glewGetProgramiv)(local_128,0x8b82,&local_d8);
  (*__glewGetProgramiv)(local_128,0x8b84,&local_dc);
  if (0 < local_dc) {
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              (in_stack_fffffffffffffe10,
               CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
               (allocator_type *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    std::allocator<char>::~allocator(&local_141);
    p_Var1 = __glewGetProgramInfoLog;
    pGVar9 = (GLsizei *)0x0;
    GVar8 = local_128;
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](&local_140,0);
    (*p_Var1)(GVar8,local_dc,pGVar9,pvVar4);
    uVar7 = 0;
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](&local_140,0);
    printf("%s\n",pvVar4);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)CONCAT44(uVar7,in_stack_fffffffffffffe00));
  }
  if (local_d8 == 0) {
    (*__glewGetProgramiv)(local_128,0x8b84,&local_148);
    uVar6 = (ulong)local_148;
    if ((long)uVar6 < 0) {
      uVar6 = 0xffffffffffffffff;
    }
    pGVar5 = (GLchar *)operator_new__(uVar6);
    (*__glewGetProgramInfoLog)(local_128,local_148,&local_148,pGVar5);
    printf("GLSL Linker Error:\n");
    printf("================================================================================\n");
    printf("%s\n",pGVar5);
    printf("\n");
    if (pGVar5 != (GLchar *)0x0) {
      operator_delete__(pGVar5);
    }
  }
  GVar8 = local_128;
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return GVar8;
}

Assistant:

GLuint OSDText::compile_shaders() {

  // create the shaders
  GLuint vert_shader = glCreateShader(GL_VERTEX_SHADER);
  GLuint frag_shader = glCreateShader(GL_FRAGMENT_SHADER);

#ifdef __APPLE__
  std::string version = "#version 150\n";
#else
  std::string version = "#version 130\n";
#endif

  std::string vert_shader_src = version + std::string("in vec4 coord;"
  "\nout vec2 texpos;"
  "\nvoid main(void) {"
  "\n  gl_Position = vec4(coord.xy, 0, 1);"
  "\n  texpos = coord.zw;"
  "\n}");

  std::string frag_shader_src = version + std::string("uniform sampler2D tex;"
  "\nuniform vec4 color;"
  "\nin vec2 texpos;"
  "\nout vec4 fragColor;"
  "\nvoid main(void) {"
  "\n  fragColor = vec4(1, 1, 1, texture(tex, texpos).r) * color;"
  "\n}");

// with drop shadow
//  "\nvarying vec2 texpos;"
//  "\nuniform sampler2D tex;"
//  "\nuniform vec4 color;"
//  "\n"
//  "\nconst float smoothing = 1.0/4.0;"
//  "\nconst vec2 shadowOffset = vec2(-1.0/512.0);"
//  "\nconst vec4 glowColor = vec4(vec3(0.1), 1.0);"
//  "\nconst float glowMin = 0.2;"
//  "\nconst float glowMax = 0.8;"
//  "\n"
//  "\n// drop shadow computed in fragment shader"
//  "\nvoid main() {"
//  "\n    vec4 texColor = texture2D(tex, texpos);"
//  "\n    float dst = texColor.a;"
//  "\n    float alpha = smoothstep(0.5 - smoothing, 0.5 + smoothing, dst);"
//  "\n"
//  "\n    float glowDst = texture2D(tex, texpos + shadowOffset).a;"
//  "\n    vec4 glow = glowColor * smoothstep(glowMin, glowMax, glowDst);"
//  "\n"
//  "\n    float mask = 1.0-alpha;"
//  "\n"
//  "\n    vec4 base = color * vec4(vec3(1.0), dst);"
//  "\n    gl_FragColor = mix(base, glow, mask);"
//  "\n}";

  GLint result = GL_FALSE;
  int info_length;

  // compile Vertex Shader
  const char* src = vert_shader_src.c_str();
  glShaderSource(vert_shader, 1, &src, NULL);
  glCompileShader(vert_shader);

  // check Vertex Shader
  glGetShaderiv(vert_shader, GL_COMPILE_STATUS, &result);
  glGetShaderiv(vert_shader, GL_INFO_LOG_LENGTH, &info_length);
  if ( info_length > 0 ){
    vector<char> vert_shader_errmsg(info_length+1);
    glGetShaderInfoLog(vert_shader, info_length, NULL, &vert_shader_errmsg[0]);
    printf("%s\n", &vert_shader_errmsg[0]);
  }

  // compile Fragment Shader
  src = frag_shader_src.c_str();
  glShaderSource(frag_shader, 1, &src, NULL);
  glCompileShader(frag_shader);

  // check Fragment Shader
  glGetShaderiv(frag_shader, GL_COMPILE_STATUS, &result);
  glGetShaderiv(frag_shader, GL_INFO_LOG_LENGTH, &info_length);
  if ( info_length > 0 ){
    vector<char> frag_shader_errmsg(info_length+1);
    glGetShaderInfoLog(frag_shader, info_length, NULL, &frag_shader_errmsg[0]);
    printf("%s\n", &frag_shader_errmsg[0]);
  }

  // link the program
  GLuint program_id = glCreateProgram();
  glAttachShader(program_id, vert_shader);
  glAttachShader(program_id, frag_shader);
  glLinkProgram(program_id);

  // check the program
  glGetProgramiv(program_id, GL_LINK_STATUS, &result);
  glGetProgramiv(program_id, GL_INFO_LOG_LENGTH, &info_length);
  if ( info_length > 0 ){
    vector<char> program_errmsg(info_length+1);
    glGetProgramInfoLog(program_id, info_length, NULL, &program_errmsg[0]);
    printf("%s\n", &program_errmsg[0]);
  }

  if (!result) {
    // get the length of the error message
    GLint errorMessageLength;
    glGetProgramiv(program_id, GL_INFO_LOG_LENGTH, &errorMessageLength);

    // get the error message itself
    char* errorMessage = new char[errorMessageLength];
    glGetProgramInfoLog(program_id, errorMessageLength, &errorMessageLength, errorMessage);

    // print it
    printf("GLSL Linker Error:\n");
    printf("================================================================================\n");
    printf("%s\n", errorMessage);
    printf("\n");

    delete [] errorMessage;
  }


  // glDetachShader(1, vert_shader);
  // glDetachShader(1, frag_shader);
  // glDeleteShader(vert_shader);
  // glDeleteShader(frag_shader);

  return program_id;
}